

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int av1_init_parallel_frame_context
              (AV1_COMP_DATA *first_cpi_data,AV1_PRIMARY *ppi,int *ref_buffers_used_map)

{
  uint uVar1;
  int iVar2;
  RefFrameMapPair *ref_frame_map_pairs_00;
  lookahead_entry *plVar3;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  int *unaff_retaddr;
  lookahead_entry *prev_source;
  AV1_COMP *in_stack_00000010;
  int src_index;
  AV1_COMP_DATA *cur_cpi_data;
  AV1_COMP *cur_cpi;
  int i;
  RefFrameMapPair first_ref_frame_map_pairs [8];
  RefFrameMapPair ref_frame_map_pairs [8];
  FIRSTPASS_STATS *stats_in;
  int cur_frame_disp;
  int frames_to_fwd_kf;
  int frames_to_key;
  int frames_since_key;
  int show_frame_count;
  int cur_frame_num;
  int parallel_frame_count;
  int gf_index_start;
  GF_GROUP *gf_group;
  AV1_COMP *first_cpi;
  int in_stack_ffffffffffffff0c;
  RefFrameMapPair *in_stack_ffffffffffffff10;
  AV1_COMP *in_stack_ffffffffffffff18;
  AV1_COMP *cpi;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint uVar4;
  undefined1 local_d8 [64];
  undefined4 local_98 [18];
  FIRSTPASS_STATS *local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  uint local_34;
  int local_30;
  uint local_2c;
  long local_28;
  long local_20;
  int *local_18;
  long local_10;
  long local_8;
  
  local_20 = *(long *)(in_RSI + 0x160);
  local_28 = in_RSI + 400;
  local_2c = (uint)*(byte *)(local_20 + 0x712c0);
  local_30 = 0;
  local_34 = *(uint *)(local_20 + 0x3bf90);
  local_38 = *(int *)(local_20 + 0x712f0);
  local_3c = *(int *)(local_20 + 0x607a0);
  local_40 = *(int *)(local_20 + 0x6079c);
  local_44 = *(int *)(local_20 + 0x607a4);
  local_48 = local_34 + *(byte *)(in_RSI + 0x28a + (long)(int)local_2c);
  local_50 = *(FIRSTPASS_STATS **)(local_20 + 0x9d618);
  if (*(long *)(local_20 + 0x3c068) != 0) {
    **(int **)(local_20 + 0x3c068) = **(int **)(local_20 + 0x3c068) + -1;
    *(undefined8 *)(local_20 + 0x3c068) = 0;
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  init_ref_map_pair((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    (RefFrameMapPair *)in_stack_ffffffffffffff18);
  memcpy(local_98,local_d8,0x40);
  if (*(char *)(local_28 + (int)local_2c) == '\x06') {
    iVar2 = av1_calc_refresh_idx_for_intnl_arf
                      (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c
                      );
    *(int *)(local_20 + 0x9d5c4) = iVar2;
    *(undefined1 *)(local_20 + 0x9d5c8) = 1;
    local_98[(long)*(int *)(local_20 + 0x9d5c4) * 2 + 1] =
         *(undefined4 *)(local_28 + 0x1c64 + (long)(int)local_2c * 4);
    local_98[(long)*(int *)(local_20 + 0x9d5c4) * 2] =
         *(undefined4 *)(local_28 + 0x2f0 + (long)(int)local_2c * 4);
  }
  *(undefined1 *)(local_20 + 0x9d5d0) = 0;
  if (*(char *)(local_28 + 0xfa + (long)(int)local_2c) == '\0') {
    *(undefined8 *)(local_20 + 0x60758) = *(undefined8 *)(local_10 + 0x138);
    *(undefined8 *)(local_20 + 0x60760) = *(undefined8 *)(local_10 + 0x140);
  }
  av1_get_ref_frames((RefFrameMapPair *)cur_cpi,cur_cpi_data._4_4_,in_stack_00000010,
                     prev_source._4_4_,(int)prev_source,unaff_retaddr);
  scale_references_fpmt
            ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (int *)in_stack_ffffffffffffff18);
  local_30 = local_30 + 1;
  uVar1 = local_2c;
  do {
    uVar4 = uVar1 + 1;
    if (*(int *)(local_28 + 0x1878) <= (int)uVar4) goto LAB_00549685;
    if (*(char *)(local_28 + 0xfa + (long)(int)uVar1) == '\0') {
      local_34 = local_34 + 1;
      local_38 = local_38 + 1;
      if (local_44 < 1) {
        local_44 = *(int *)(local_20 + 0x42384);
      }
      if (local_40 != 0) {
        local_3c = local_3c + 1;
        local_40 = local_40 + -1;
        local_44 = local_44 + -1;
      }
      local_50 = local_50 + 1;
    }
    local_48 = local_34 + *(byte *)(local_28 + 0xfa + (long)(int)uVar4);
    if (*(int *)(local_28 + 0x2fec + (long)(int)uVar4 * 4) == 2) {
      cpi = *(AV1_COMP **)(local_10 + (long)local_30 * 8);
      ref_frame_map_pairs_00 = (RefFrameMapPair *)(local_10 + 0x20 + (long)(local_30 + -1) * 0x48);
      cpi->gf_frame_index = (uchar)uVar4;
      cpi->framerate = *(double *)(local_20 + 0x608b0);
      (cpi->common).current_frame.frame_number = local_34;
      (cpi->common).current_frame.frame_type = *(FRAME_TYPE *)(local_28 + 0x1680 + (long)(int)uVar4)
      ;
      (cpi->frame_index_set).show_frame_count = local_38;
      (cpi->rc).frames_since_key = local_3c;
      (cpi->rc).frames_to_key = local_40;
      (cpi->rc).frames_to_fwd_kf = local_44;
      (cpi->rc).active_worst_quality = *(int *)(local_20 + 0x60844);
      (cpi->rc).avg_frame_bandwidth = *(int *)(local_20 + 0x607f4);
      (cpi->rc).max_frame_bandwidth = *(int *)(local_20 + 0x607fc);
      (cpi->rc).min_frame_bandwidth = *(int *)(local_20 + 0x607f8);
      (cpi->rc).intervals_till_gf_calculate_due = *(int *)(local_20 + 0x6078c);
      (cpi->mv_search_params).max_mv_magnitude = *(int *)(local_20 + 0x60df8);
      if (*(char *)(local_28 + (ulong)cpi->gf_frame_index) == '\x06') {
        (cpi->common).lf.mode_ref_delta_enabled = '\x01';
      }
      cpi->do_frame_data_update = false;
      if (*(char *)(local_28 + 0xfa + (long)(int)uVar4) == '\0') {
        in_stack_ffffffffffffff0c = *(int *)(local_28 + 0x187c + (long)(int)uVar4 * 4);
        plVar3 = av1_lookahead_peek(*(lookahead_ctx **)(local_10 + 0x170),
                                    in_stack_ffffffffffffff0c + -1,cpi->compressor_stage);
        (cpi->time_stamps).prev_ts_start = plVar3->ts_start;
        (cpi->time_stamps).prev_ts_end = plVar3->ts_end;
      }
      (cpi->time_stamps).first_ts_start = *(int64_t *)(local_20 + 0x60768);
      memcpy((cpi->common).ref_frame_map,(void *)(local_20 + 0x3c120),0x40);
      ref_frame_map_pairs_00[3].pyr_level = 0;
      ref_frame_map_pairs_00[7] = *(RefFrameMapPair *)(local_8 + 0x38);
      ref_frame_map_pairs_00[6].pyr_level = *(int *)(local_8 + 0x30);
      ref_frame_map_pairs_00[2].pyr_level = 0;
      ref_frame_map_pairs_00[2].disp_order = 0;
      if (*(char *)(local_28 + (int)local_2c) == '\x06') {
        ref_frame_map_pairs_00[3].pyr_level = *(int *)(local_8 + 0x18);
        iVar2 = av1_calc_refresh_idx_for_intnl_arf
                          (cpi,ref_frame_map_pairs_00,in_stack_ffffffffffffff0c);
        cpi->ref_refresh_index = iVar2;
        cpi->refresh_idx_available = true;
        cpi->ref_idx_to_skip = *(int *)(local_20 + 0x9d5c4);
      }
      else {
        cpi->ref_idx_to_skip = -1;
        cpi->ref_refresh_index = -1;
        cpi->refresh_idx_available = false;
      }
      (cpi->twopass_frame).stats_in = local_50;
      av1_get_ref_frames((RefFrameMapPair *)cur_cpi,cur_cpi_data._4_4_,in_stack_00000010,
                         prev_source._4_4_,(int)prev_source,unaff_retaddr);
      scale_references_fpmt((AV1_COMP *)CONCAT44(uVar4,in_stack_ffffffffffffff20),(int *)cpi);
      local_30 = local_30 + 1;
    }
  } while ((uVar4 != *(int *)(local_28 + 0x1878) - 1U) &&
          (((*(int *)(local_28 + 0x2fec + (long)(int)(uVar4 + 1) * 4) != 0 ||
            ((*(char *)(local_28 + (int)(uVar4 + 1)) != '\x03' &&
             (*(char *)(local_28 + (int)(uVar4 + 1)) != '\x06')))) &&
           (uVar1 = uVar4, *(int *)(local_28 + 0x2fec + (long)(int)(uVar4 + 1) * 4) != 1))));
  *(undefined1 *)(*(long *)(local_10 + (long)(local_30 + -1) * 8) + 0x9d5d0) = 1;
LAB_00549685:
  increment_scaled_ref_counts_fpmt(*(BufferPool **)(local_20 + 0x42270),*local_18);
  return local_30;
}

Assistant:

int av1_init_parallel_frame_context(const AV1_COMP_DATA *const first_cpi_data,
                                    AV1_PRIMARY *const ppi,
                                    int *ref_buffers_used_map) {
  AV1_COMP *const first_cpi = ppi->cpi;
  GF_GROUP *const gf_group = &ppi->gf_group;
  int gf_index_start = first_cpi->gf_frame_index;
  assert(gf_group->frame_parallel_level[gf_index_start] == 1);
  int parallel_frame_count = 0;
  int cur_frame_num = first_cpi->common.current_frame.frame_number;
  int show_frame_count = first_cpi->frame_index_set.show_frame_count;
  int frames_since_key = first_cpi->rc.frames_since_key;
  int frames_to_key = first_cpi->rc.frames_to_key;
  int frames_to_fwd_kf = first_cpi->rc.frames_to_fwd_kf;
  int cur_frame_disp = cur_frame_num + gf_group->arf_src_offset[gf_index_start];
  const FIRSTPASS_STATS *stats_in = first_cpi->twopass_frame.stats_in;

  assert(*ref_buffers_used_map == 0);

  // Release the previously used frame-buffer by a frame_parallel_level 1 frame.
  if (first_cpi->common.cur_frame != NULL) {
    --first_cpi->common.cur_frame->ref_count;
    first_cpi->common.cur_frame = NULL;
  }

  RefFrameMapPair ref_frame_map_pairs[REF_FRAMES];
  RefFrameMapPair first_ref_frame_map_pairs[REF_FRAMES];
  init_ref_map_pair(first_cpi, first_ref_frame_map_pairs);
  memcpy(ref_frame_map_pairs, first_ref_frame_map_pairs,
         sizeof(RefFrameMapPair) * REF_FRAMES);

  // Store the reference refresh index of frame_parallel_level 1 frame in a
  // parallel encode set of lower layer frames.
  if (gf_group->update_type[gf_index_start] == INTNL_ARF_UPDATE) {
    first_cpi->ref_refresh_index = av1_calc_refresh_idx_for_intnl_arf(
        first_cpi, ref_frame_map_pairs, gf_index_start);
    assert(first_cpi->ref_refresh_index != INVALID_IDX &&
           first_cpi->ref_refresh_index < REF_FRAMES);
    first_cpi->refresh_idx_available = true;
    // Update ref_frame_map_pairs.
    ref_frame_map_pairs[first_cpi->ref_refresh_index].disp_order =
        gf_group->display_idx[gf_index_start];
    ref_frame_map_pairs[first_cpi->ref_refresh_index].pyr_level =
        gf_group->layer_depth[gf_index_start];
  }

  // Set do_frame_data_update flag as false for frame_parallel_level 1 frame.
  first_cpi->do_frame_data_update = false;
  if (gf_group->arf_src_offset[gf_index_start] == 0) {
    first_cpi->time_stamps.prev_ts_start = ppi->ts_start_last_show_frame;
    first_cpi->time_stamps.prev_ts_end = ppi->ts_end_last_show_frame;
  }

  av1_get_ref_frames(first_ref_frame_map_pairs, cur_frame_disp, first_cpi,
                     gf_index_start, 1, first_cpi->common.remapped_ref_idx);

  scale_references_fpmt(first_cpi, ref_buffers_used_map);
  parallel_frame_count++;

  // Iterate through the GF_GROUP to find the remaining frame_parallel_level 2
  // frames which are part of the current parallel encode set and initialize the
  // required cpi elements.
  for (int i = gf_index_start + 1; i < gf_group->size; i++) {
    // Update frame counters if previous frame was show frame or show existing
    // frame.
    if (gf_group->arf_src_offset[i - 1] == 0) {
      cur_frame_num++;
      show_frame_count++;
      if (frames_to_fwd_kf <= 0)
        frames_to_fwd_kf = first_cpi->oxcf.kf_cfg.fwd_kf_dist;
      if (frames_to_key) {
        frames_since_key++;
        frames_to_key--;
        frames_to_fwd_kf--;
      }
      stats_in++;
    }
    cur_frame_disp = cur_frame_num + gf_group->arf_src_offset[i];
    if (gf_group->frame_parallel_level[i] == 2) {
      AV1_COMP *cur_cpi = ppi->parallel_cpi[parallel_frame_count];
      AV1_COMP_DATA *cur_cpi_data =
          &ppi->parallel_frames_data[parallel_frame_count - 1];
      cur_cpi->gf_frame_index = i;
      cur_cpi->framerate = first_cpi->framerate;
      cur_cpi->common.current_frame.frame_number = cur_frame_num;
      cur_cpi->common.current_frame.frame_type = gf_group->frame_type[i];
      cur_cpi->frame_index_set.show_frame_count = show_frame_count;
      cur_cpi->rc.frames_since_key = frames_since_key;
      cur_cpi->rc.frames_to_key = frames_to_key;
      cur_cpi->rc.frames_to_fwd_kf = frames_to_fwd_kf;
      cur_cpi->rc.active_worst_quality = first_cpi->rc.active_worst_quality;
      cur_cpi->rc.avg_frame_bandwidth = first_cpi->rc.avg_frame_bandwidth;
      cur_cpi->rc.max_frame_bandwidth = first_cpi->rc.max_frame_bandwidth;
      cur_cpi->rc.min_frame_bandwidth = first_cpi->rc.min_frame_bandwidth;
      cur_cpi->rc.intervals_till_gf_calculate_due =
          first_cpi->rc.intervals_till_gf_calculate_due;
      cur_cpi->mv_search_params.max_mv_magnitude =
          first_cpi->mv_search_params.max_mv_magnitude;
      if (gf_group->update_type[cur_cpi->gf_frame_index] == INTNL_ARF_UPDATE) {
        cur_cpi->common.lf.mode_ref_delta_enabled = 1;
      }
      cur_cpi->do_frame_data_update = false;
      // Initialize prev_ts_start and prev_ts_end for show frame(s) and show
      // existing frame(s).
      if (gf_group->arf_src_offset[i] == 0) {
        // Choose source of prev frame.
        int src_index = gf_group->src_offset[i];
        struct lookahead_entry *prev_source = av1_lookahead_peek(
            ppi->lookahead, src_index - 1, cur_cpi->compressor_stage);
        // Save timestamps of prev frame.
        cur_cpi->time_stamps.prev_ts_start = prev_source->ts_start;
        cur_cpi->time_stamps.prev_ts_end = prev_source->ts_end;
      }
      cur_cpi->time_stamps.first_ts_start =
          first_cpi->time_stamps.first_ts_start;

      memcpy(cur_cpi->common.ref_frame_map, first_cpi->common.ref_frame_map,
             sizeof(first_cpi->common.ref_frame_map));
      cur_cpi_data->lib_flags = 0;
      cur_cpi_data->timestamp_ratio = first_cpi_data->timestamp_ratio;
      cur_cpi_data->flush = first_cpi_data->flush;
      cur_cpi_data->frame_size = 0;
      if (gf_group->update_type[gf_index_start] == INTNL_ARF_UPDATE) {
        // If the first frame in a parallel encode set is INTNL_ARF_UPDATE
        // frame, initialize lib_flags of frame_parallel_level 2 frame in the
        // set with that of frame_parallel_level 1 frame.
        cur_cpi_data->lib_flags = first_cpi_data->lib_flags;
        // Store the reference refresh index of frame_parallel_level 2 frame in
        // a parallel encode set of lower layer frames.
        cur_cpi->ref_refresh_index =
            av1_calc_refresh_idx_for_intnl_arf(cur_cpi, ref_frame_map_pairs, i);
        cur_cpi->refresh_idx_available = true;
        // Skip the reference frame which will be refreshed by
        // frame_parallel_level 1 frame in a parallel encode set of lower layer
        // frames.
        cur_cpi->ref_idx_to_skip = first_cpi->ref_refresh_index;
      } else {
        cur_cpi->ref_idx_to_skip = INVALID_IDX;
        cur_cpi->ref_refresh_index = INVALID_IDX;
        cur_cpi->refresh_idx_available = false;
      }
      cur_cpi->twopass_frame.stats_in = stats_in;

      av1_get_ref_frames(first_ref_frame_map_pairs, cur_frame_disp, cur_cpi, i,
                         1, cur_cpi->common.remapped_ref_idx);
      scale_references_fpmt(cur_cpi, ref_buffers_used_map);
      parallel_frame_count++;
    }

    // Set do_frame_data_update to true for the last frame_parallel_level 2
    // frame in the current parallel encode set.
    if (i == (gf_group->size - 1) ||
        (gf_group->frame_parallel_level[i + 1] == 0 &&
         (gf_group->update_type[i + 1] == ARF_UPDATE ||
          gf_group->update_type[i + 1] == INTNL_ARF_UPDATE)) ||
        gf_group->frame_parallel_level[i + 1] == 1) {
      ppi->parallel_cpi[parallel_frame_count - 1]->do_frame_data_update = true;
      break;
    }
  }

  increment_scaled_ref_counts_fpmt(first_cpi->common.buffer_pool,
                                   *ref_buffers_used_map);

  // Return the number of frames in the parallel encode set.
  return parallel_frame_count;
}